

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetRepaintManager::paintAndFlush(QWidgetRepaintManager *this)

{
  QWidget *pQVar1;
  QRegion *p;
  uint uVar2;
  int iVar3;
  int iVar4;
  QWidgetPrivate *pQVar5;
  pointer puVar6;
  undefined1 auVar7 [16];
  char **__s;
  long *plVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  QLoggingCategory *pQVar12;
  QDebug *pQVar13;
  undefined8 uVar14;
  QPoint QVar15;
  QGraphicsEffect *pQVar16;
  QTLWExtra *pQVar17;
  QWidget *pQVar18;
  QRect *r;
  QRect *pQVar19;
  QPaintDevice *pQVar20;
  int i_3;
  QRegion this_00;
  int i_2;
  int iVar21;
  QWidgetRepaintManager *pQVar22;
  QPlatformTextureList *this_01;
  QVarLengthArray<QWidget_*,_16LL> *this_02;
  int i;
  ulong uVar23;
  long lVar24;
  int i_1;
  int iVar25;
  ulong uVar26;
  int iVar27;
  QRect *rect;
  pointer puVar28;
  int iVar29;
  long in_FS_OFFSET;
  QRegion newVisible;
  ulong local_230;
  QPoint local_228;
  QRegion widgetDirty;
  QRegion dirtyBeforeSubtractedOpaqueChildren;
  bool hasDirtySiblingsAbove;
  QRegion toClean;
  QRegion local_200;
  undefined1 local_1f8 [16];
  QRegion dirtyCopy;
  qreal qStack_1e0;
  undefined1 *local_1d0 [4];
  undefined1 *local_1b0;
  undefined1 *puStack_1a8;
  undefined1 *local_1a0;
  undefined1 *puStack_198;
  undefined1 *local_190;
  undefined1 *puStack_188;
  undefined1 *local_180;
  undefined1 *puStack_178;
  undefined1 *local_170;
  undefined1 *puStack_168;
  undefined1 *local_160;
  undefined1 *puStack_158;
  undefined1 local_150 [24];
  char *local_138 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar12->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_138[0] = pQVar12->name;
    local_150._0_4_ = 2;
    local_150._4_4_ = 0;
    local_150._8_4_ = 0;
    local_150._12_4_ = 0;
    local_150._16_4_ = 0;
    local_150._20_4_ = 0;
    QMessageLogger::info();
    pQVar13 = QDebug::operator<<((QDebug *)&newVisible,"Painting and flushing dirty");
    pQVar13 = QDebug::operator<<(pQVar13,"top level");
    local_200.d = (QRegionData *)pQVar13->stream;
    *(int *)((Stream *)local_200.d + 0x28) = *(int *)((Stream *)local_200.d + 0x28) + 1;
    ::operator<<((Stream *)&dirtyCopy,&local_200);
    pQVar13 = QDebug::operator<<((QDebug *)&dirtyCopy,"and dirty widgets");
    local_1f8._0_8_ = pQVar13->stream;
    *(int *)(local_1f8._0_8_ + 0x28) = *(int *)(local_1f8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)(local_1f8 + 8),(QList<QWidget_*> *)local_1f8);
    QDebug::~QDebug((QDebug *)(local_1f8 + 8));
    QDebug::~QDebug((QDebug *)local_1f8);
    QDebug::~QDebug((QDebug *)&dirtyCopy);
    QDebug::~QDebug((QDebug *)&local_200);
    QDebug::~QDebug((QDebug *)&newVisible);
  }
  lVar24 = *(long *)(*(long *)this + 0x20);
  uVar2 = *(uint *)(lVar24 + 8);
  iVar21 = *(int *)(lVar24 + 0x14);
  iVar25 = *(int *)(lVar24 + 0x18);
  iVar3 = *(int *)(lVar24 + 0x1c);
  iVar4 = *(int *)(lVar24 + 0x20);
  if ((uVar2 >> 10 & 1) == 0) {
    uVar14 = QBackingStore::size();
    plVar8 = QGuiApplicationPrivate::platform_integration;
    iVar29 = (iVar3 - iVar21) + 1;
    iVar27 = (iVar4 - iVar25) + 1;
    if ((iVar29 == (int)uVar14) && (iVar27 == (int)((ulong)uVar14 >> 0x20))) {
LAB_0030e418:
      bVar11 = false;
    }
    else {
      if ((*(long *)(this + 0x78) != 0) &&
         (uVar14 = QBackingStore::size(), 0 < (int)((ulong)uVar14 >> 0x20) && 0 < (int)uVar14)) {
        cVar9 = (**(code **)(*plVar8 + 0x10))(plVar8);
        if (cVar9 != '\0') {
          uVar14 = QBackingStore::size();
          local_150._8_4_ = (int)uVar14 + -1;
          local_150._0_4_ = 0;
          local_150._4_4_ = 0;
          local_150._12_4_ = (int)((ulong)uVar14 >> 0x20) + -1;
          dirtyCopy.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          staticContents((QWidgetRepaintManager *)&dirtyCopy,(QWidget *)this,(QRect *)0x0);
          newVisible.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(&newVisible,0,0,iVar29,iVar27,Rectangle);
          QRegion::operator-=(&newVisible,&dirtyCopy);
          QRegion::operator+=((QRegion *)(this + 0x10),&newVisible);
          QBackingStore::setStaticContents(*(QRegion **)(this + 8));
          QRegion::~QRegion(&newVisible);
          QRegion::~QRegion(&dirtyCopy);
          goto LAB_0030e418;
        }
      }
      QRegion::QRegion((QRegion *)local_150,0,0,iVar29,iVar27,Rectangle);
      uVar14 = *(undefined8 *)(this + 0x10);
      pQVar22 = (QWidgetRepaintManager *)local_150;
      *(ulong *)(this + 0x10) = CONCAT44(local_150._4_4_,local_150._0_4_);
      local_150._0_4_ = (undefined4)uVar14;
      local_150._4_4_ = (undefined4)((ulong)uVar14 >> 0x20);
      QRegion::~QRegion((QRegion *)pQVar22);
      for (uVar26 = 0; uVar26 < *(ulong *)(this + 0x28); uVar26 = uVar26 + 1) {
        resetWidget(pQVar22,*(QWidget **)(*(long *)(this + 0x20) + uVar26 * 8));
      }
      QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x18));
      bVar11 = true;
    }
  }
  else {
    bVar11 = false;
  }
  uVar14 = QBackingStore::size();
  iVar21 = (iVar3 - iVar21) + 1;
  iVar25 = (iVar4 - iVar25) + 1;
  if ((iVar21 != (int)uVar14) || (iVar25 != (int)((ulong)uVar14 >> 0x20))) {
    local_150._0_4_ = iVar21;
    local_150._4_4_ = iVar25;
    QBackingStore::resize(*(QSize **)(this + 8));
  }
  if ((uVar2 >> 10 & 1) != 0) goto LAB_0030edab;
  toClean.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (QWidget *)(this + 0x10);
  QRegion::QRegion(&toClean,(QRegion *)pQVar1);
  __s = local_138;
  memset(__s,0xaa,0x100);
  local_150._0_4_ = 0x20;
  local_150._4_4_ = 0;
  local_150._8_4_ = 0;
  local_150._12_4_ = 0;
  for (uVar26 = 0; local_150._16_8_ = __s, uVar26 < *(ulong *)(this + 0x28); uVar26 = uVar26 + 1) {
    lVar24 = *(long *)(*(long *)(this + 0x20) + uVar26 * 8);
    newVisible.d = (QRegionData *)lVar24;
    pQVar5 = *(QWidgetPrivate **)(lVar24 + 8);
    if (((pQVar5->data).field_0x12 & 4) == 0) {
      _dirtyCopy = QWidgetPrivate::clipRect(pQVar5);
      p = &pQVar5->dirty;
      QRegion::operator&=(p,(QRect *)&dirtyCopy);
      QWidgetPrivate::clipToEffectiveMask(pQVar5,p);
      hasDirtySiblingsAbove = false;
      if ((pQVar5->field_0x252 & 0x20) == 0) {
        QWidgetPrivate::subtractOpaqueSiblings(pQVar5,p,&hasDirtySiblingsAbove,false);
      }
      dirtyBeforeSubtractedOpaqueChildren.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&dirtyBeforeSubtractedOpaqueChildren,p);
      if ((pQVar5->field_0x252 & 0x30) == 0) {
        _dirtyCopy = QWidget::rect((QWidget *)newVisible.d);
        QWidgetPrivate::subtractOpaqueChildren(pQVar5,p,(QRect *)&dirtyCopy);
      }
      cVar9 = QRegion::isEmpty();
      if ((cVar9 != '\0') && ((pQVar5->field_0x253 & 2) != 0)) {
        QRegion::operator=(p,&dirtyBeforeSubtractedOpaqueChildren);
      }
      pQVar22 = (QWidgetRepaintManager *)p;
      cVar9 = QRegion::isEmpty();
      if (cVar9 == '\0') {
        widgetDirty.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        if ((QWidget *)newVisible.d == *(QWidget **)this) {
          QRegion::QRegion(&widgetDirty,p);
        }
        else {
          local_228.xp.m_i = 0;
          local_228.yp.m_i = 0;
          QVar15 = QWidget::mapTo((QWidget *)newVisible.d,*(QWidget **)this,&local_228);
          dirtyCopy.d = (QRegionData *)QVar15;
          QRegion::translated(&widgetDirty,(QPoint *)p);
        }
        pQVar22 = (QWidgetRepaintManager *)&toClean;
        QRegion::operator+=((QRegion *)pQVar22,&widgetDirty);
        this_00.d = newVisible.d;
        if (*(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10) == 0) {
          do {
            pQVar18 = (QWidget *)this_00.d;
            pQVar16 = QWidget::graphicsEffect((QWidget *)this_00.d);
            if (pQVar16 != (QGraphicsEffect *)0x0) goto LAB_0030e80f;
            this_00.d = *(QRegionData **)(*(long *)&((QWidget *)this_00.d)->field_0x8 + 0x10);
          } while ((QWidget *)this_00.d != (QWidget *)0x0);
          if ((hasDirtySiblingsAbove == false) && ((pQVar5->field_0x252 & 2) != 0)) {
            _dirtyCopy = (QRect)QRegion::boundingRect();
            pQVar18 = pQVar1;
            cVar9 = QRegion::intersects((QRect *)pQVar1);
            if (cVar9 == '\0') {
              QVarLengthArray<QWidget_*,_32LL>::append
                        ((QVarLengthArray<QWidget_*,_32LL> *)local_150,(QWidget **)&newVisible);
              goto LAB_0030e826;
            }
          }
LAB_0030e80f:
          resetWidget((QWidgetRepaintManager *)pQVar18,(QWidget *)newVisible.d);
          QRegion::operator+=((QRegion *)pQVar1,&widgetDirty);
        }
        else {
          resetWidget(pQVar22,(QWidget *)newVisible.d);
        }
LAB_0030e826:
        QRegion::~QRegion(&widgetDirty);
      }
      else {
        resetWidget(pQVar22,(QWidget *)newVisible.d);
      }
      QRegion::~QRegion(&dirtyBeforeSubtractedOpaqueChildren);
      __s = (char **)local_150._16_8_;
    }
  }
  QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x18));
  pQVar17 = QWidgetPrivate::topData(*(QWidgetPrivate **)(*(long *)this + 8));
  std::
  vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
  ::clear(&pQVar17->widgetTextures);
  findAllTextureWidgetsRecursively(*(QWidget **)this,*(QWidget **)this);
  this_01 = (QPlatformTextureList *)&toClean;
  cVar9 = QRegion::isEmpty();
  if (cVar9 == '\0') {
    puVar6 = (pQVar17->widgetTextures).
             super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar28 = (pQVar17->widgetTextures).
                   super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar28 != puVar6;
        puVar28 = puVar28 + 1) {
      iVar21 = 0;
      while( true ) {
        this_01 = (puVar28->_M_t).
                  super___uniq_ptr_impl<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QPlatformTextureList_*,_std::default_delete<QPlatformTextureList>_>
                  .super__Head_base<0UL,_QPlatformTextureList_*,_false>._M_head_impl;
        iVar25 = QPlatformTextureList::count();
        if (iVar25 <= iVar21) break;
        uVar14 = QPlatformTextureList::source
                           ((int)(puVar28->_M_t).
                                 super___uniq_ptr_impl<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPlatformTextureList_*,_std::default_delete<QPlatformTextureList>_>
                                 .super__Head_base<0UL,_QPlatformTextureList_*,_false>._M_head_impl)
        ;
        newVisible.d = (QRegionData *)uVar14;
        bVar10 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                           ((QListSpecialMethodsBase<QWidget*> *)(this + 0x30),
                            (QWidget **)&newVisible);
        if (bVar10) {
          dirtyCopy.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          _dirtyCopy = (QRect)QPlatformTextureList::geometry
                                        ((int)(puVar28->_M_t).
                                              super___uniq_ptr_impl<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_QPlatformTextureList_*,_std::default_delete<QPlatformTextureList>_>
                                              .super__Head_base<0UL,_QPlatformTextureList_*,_false>.
                                              _M_head_impl);
          *(uint *)(*(long *)(newVisible.d + 8) + 0x250) =
               *(uint *)(*(long *)(newVisible.d + 8) + 0x250) | 0x8000000;
          QRegion::operator+=((QRegion *)pQVar1,(QRect *)&dirtyCopy);
          QRegion::operator+=(&toClean,(QRect *)&dirtyCopy);
        }
        iVar21 = iVar21 + 1;
      }
    }
    for (uVar26 = 0; uVar26 < *(ulong *)(this + 0x40); uVar26 = uVar26 + 1) {
      resetWidget((QWidgetRepaintManager *)this_01,
                  *(QWidget **)(*(long *)(this + 0x38) + uVar26 * 8));
    }
    QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x30));
    if (*(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10) == 0) {
      QBackingStore::beginPaint(*(QRegion **)(this + 8));
      updateStaticContentsSize(this);
      dirtyCopy.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&dirtyCopy,(QRegion *)pQVar1);
      QRegion::QRegion(&newVisible);
      uVar14 = *(undefined8 *)(this + 0x10);
      *(QRegionData **)(this + 0x10) = newVisible.d;
      newVisible.d = (QRegionData *)uVar14;
      QRegion::~QRegion(&newVisible);
      this[0x88] = (QWidgetRepaintManager)0x0;
      for (lVar24 = 0; lVar24 < CONCAT44(local_150._12_4_,local_150._8_4_); lVar24 = lVar24 + 1) {
        pQVar1 = *(QWidget **)(local_150._16_8_ + lVar24 * 8);
        pQVar5 = *(QWidgetPrivate **)&pQVar1->field_0x8;
        uVar2 = *(uint *)&pQVar5->field_0x250;
        pQVar18 = *(QWidget **)this;
        newVisible.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar22 = (QWidgetRepaintManager *)&newVisible;
        QRegion::QRegion((QRegion *)pQVar22,&pQVar5->dirty);
        resetWidget(pQVar22,pQVar1);
        dirtyBeforeSubtractedOpaqueChildren.d = (QRegionData *)0x0;
        if (pQVar1 != *(QWidget **)this) {
          widgetDirty.d = (QRegionData *)0x0;
          QVar15 = QWidget::mapTo(pQVar1,*(QWidget **)this,(QPoint *)&widgetDirty);
          dirtyBeforeSubtractedOpaqueChildren.d._4_4_ =
               dirtyBeforeSubtractedOpaqueChildren.d._4_4_ + QVar15.yp.m_i.m_i;
          dirtyBeforeSubtractedOpaqueChildren.d._0_4_ =
               (int)dirtyBeforeSubtractedOpaqueChildren.d + QVar15.xp.m_i.m_i;
        }
        pQVar20 = (QPaintDevice *)QBackingStore::paintDevice();
        QWidgetPrivate::drawWidget
                  (pQVar5,pQVar20,&newVisible,(QPoint *)&dirtyBeforeSubtractedOpaqueChildren,
                   (DrawWidgetFlags)
                   ((uint)((uVar2 & 0x300000) == 0) * 0x20 + (uint)(pQVar1 == pQVar18) + 4),
                   (QPainter *)0x0,(QWidgetRepaintManager *)this);
        QRegion::~QRegion(&newVisible);
      }
      if (bVar11) {
LAB_0030ed3d:
        pQVar5 = *(QWidgetPrivate **)(*(long *)this + 8);
        pQVar20 = (QPaintDevice *)QBackingStore::paintDevice();
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_230;
        _newVisible = (QRect)(auVar7 << 0x40);
        QWidgetPrivate::drawWidget
                  (pQVar5,pQVar20,&dirtyCopy,(QPoint *)&newVisible,(DrawWidgetFlags)0x105,
                   (QPainter *)0x0,(QWidgetRepaintManager *)this);
      }
      else {
        cVar9 = QRegion::isEmpty();
        if (cVar9 == '\0') goto LAB_0030ed3d;
      }
      QBackingStore::endPaint();
      flush(this);
      QRegion::~QRegion(&dirtyCopy);
    }
    else {
      updateStaticContentsSize(this);
      QRegion::QRegion(&dirtyCopy);
      uVar14 = *(undefined8 *)(this + 0x10);
      *(QRegionData **)(this + 0x10) = dirtyCopy.d;
      dirtyCopy.d = (QRegionData *)uVar14;
      QRegion::~QRegion(&dirtyCopy);
      this[0x88] = (QWidgetRepaintManager)0x0;
      r = (QRect *)QRegion::begin();
      pQVar19 = (QRect *)QRegion::end();
      for (; r != pQVar19; r = r + 1) {
        lVar24 = *(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10);
        QRectF::QRectF((QRectF *)&dirtyCopy,r);
        QGraphicsItem::update((QGraphicsItem *)(lVar24 + 0x10),(QRectF *)&dirtyCopy);
      }
    }
  }
  else {
    local_160 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_158 = &DAT_aaaaaaaaaaaaaaaa;
    local_170 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_168 = &DAT_aaaaaaaaaaaaaaaa;
    local_180 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_178 = &DAT_aaaaaaaaaaaaaaaa;
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_198 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1d0[2] = &DAT_aaaaaaaaaaaaaaaa;
    local_1d0[3] = &DAT_aaaaaaaaaaaaaaaa;
    local_1d0[0] = &DAT_aaaaaaaaaaaaaaaa;
    local_1d0[1] = &DAT_aaaaaaaaaaaaaaaa;
    _dirtyCopy = (QRect)ZEXT816(0x10);
    uVar26 = *(ulong *)(this + 0x40);
    iVar21 = (int)uVar26;
    QVarLengthArray<QWidget_*,_16LL>::reserve
              ((QVarLengthArray<QWidget_*,_16LL> *)&dirtyCopy,(long)iVar21);
    uVar23 = 0;
    uVar26 = uVar26 & 0xffffffff;
    if (iVar21 < 1) {
      uVar26 = uVar23;
    }
    for (; uVar26 != uVar23; uVar23 = uVar23 + 1) {
      newVisible.d = (QRegionData *)*(undefined8 *)(*(long *)(this + 0x38) + uVar23 * 8);
      this_02 = (QVarLengthArray<QWidget_*,_16LL> *)&dirtyCopy;
      QVarLengthArray<QWidget_*,_16LL>::append
                ((QVarLengthArray<QWidget_*,_16LL> *)&dirtyCopy,(QWidget **)&newVisible);
      resetWidget((QWidgetRepaintManager *)this_02,(QWidget *)newVisible.d);
    }
    QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x30));
    for (uVar23 = 0; uVar26 != uVar23; uVar23 = uVar23 + 1) {
      pQVar1 = (QWidget *)local_1d0[uVar23];
      pQVar5 = *(QWidgetPrivate **)&pQVar1->field_0x8;
      _newVisible = QWidget::rect(pQVar1);
      QRegion::QRegion(&dirtyBeforeSubtractedOpaqueChildren,(QRect *)&newVisible,Rectangle);
      QWidgetPrivate::sendPaintEvent(pQVar5,&dirtyBeforeSubtractedOpaqueChildren);
      QRegion::~QRegion(&dirtyBeforeSubtractedOpaqueChildren);
      if (pQVar1 != *(QWidget **)this) {
        pQVar18 = QWidget::nativeParentWidget(pQVar1);
        bVar11 = hasPlatformWindow(pQVar1);
        if ((bVar11) || ((pQVar18 != (QWidget *)0x0 && (pQVar18 != *(QWidget **)this)))) {
          bVar11 = hasPlatformWindow(pQVar1);
          if (bVar11) {
            pQVar18 = pQVar1;
          }
          QRegion::QRegion(&newVisible);
          markNeedsFlush(this,pQVar18,&newVisible);
          QRegion::~QRegion(&newVisible);
        }
      }
    }
    flush(this);
    QVarLengthArray<QWidget_*,_16LL>::~QVarLengthArray
              ((QVarLengthArray<QWidget_*,_16LL> *)&dirtyCopy);
  }
  QVarLengthArray<QWidget_*,_32LL>::~QVarLengthArray((QVarLengthArray<QWidget_*,_32LL> *)local_150);
  QRegion::~QRegion(&toClean);
LAB_0030edab:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::paintAndFlush()
{
    qCInfo(lcWidgetPainting) << "Painting and flushing dirty"
        << "top level" << dirty << "and dirty widgets" << dirtyWidgets;

    const bool updatesDisabled = !tlw->updatesEnabled();
    bool repaintAllWidgets = false;

    const QRect tlwRect = tlw->data->crect;
    if (!updatesDisabled && store->size() != tlwRect.size()) {
        QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
        if (hasStaticContents() && !store->size().isEmpty()
            && integration->hasCapability(QPlatformIntegration::BackingStoreStaticContents)) {
            // Repaint existing dirty area and newly visible area.
            const QRect clipRect(QPoint(0, 0), store->size());
            const QRegion staticRegion(staticContents(nullptr, clipRect));
            QRegion newVisible(0, 0, tlwRect.width(), tlwRect.height());
            newVisible -= staticRegion;
            dirty += newVisible;
            store->setStaticContents(staticRegion);
        } else {
            // Repaint everything.
            dirty = QRegion(0, 0, tlwRect.width(), tlwRect.height());
            for (int i = 0; i < dirtyWidgets.size(); ++i)
                resetWidget(dirtyWidgets.at(i));
            dirtyWidgets.clear();
            repaintAllWidgets = true;
        }
    }

    if (store->size() != tlwRect.size())
        store->resize(tlwRect.size());

    if (updatesDisabled)
        return;

    // Contains everything that needs repaint.
    QRegion toClean(dirty);

    // Loop through all update() widgets and remove them from the list before they are
    // painted (in case someone calls update() in paintEvent). If the widget is opaque
    // and does not have transparent overlapping siblings, append it to the
    // opaqueNonOverlappedWidgets list and paint it directly without composition.
    QVarLengthArray<QWidget *, 32> opaqueNonOverlappedWidgets;
    for (int i = 0; i < dirtyWidgets.size(); ++i) {
        QWidget *w = dirtyWidgets.at(i);
        QWidgetPrivate *wd = w->d_func();
        if (wd->data.in_destructor)
            continue;

        // Clip with mask() and clipRect().
        wd->dirty &= wd->clipRect();
        wd->clipToEffectiveMask(wd->dirty);

        // Subtract opaque siblings and children.
        bool hasDirtySiblingsAbove = false;
        // We know for sure that the widget isn't overlapped if 'isMoved' is true.
        if (!wd->isMoved)
            wd->subtractOpaqueSiblings(wd->dirty, &hasDirtySiblingsAbove);

        // Make a copy of the widget's dirty region, to restore it in case there is an opaque
        // render-to-texture child that completely covers the widget, because otherwise the
        // render-to-texture child won't be visible, due to its parent widget not being redrawn
        // with a proper blending mask.
        const QRegion dirtyBeforeSubtractedOpaqueChildren = wd->dirty;

        // Scrolled and moved widgets must draw all children.
        if (!wd->isScrolled && !wd->isMoved)
            wd->subtractOpaqueChildren(wd->dirty, w->rect());

        if (wd->dirty.isEmpty() && wd->textureChildSeen)
            wd->dirty = dirtyBeforeSubtractedOpaqueChildren;

        if (wd->dirty.isEmpty()) {
            resetWidget(w);
            continue;
        }

        const QRegion widgetDirty(w != tlw ? wd->dirty.translated(w->mapTo(tlw, QPoint()))
                                           : wd->dirty);
        toClean += widgetDirty;

#if QT_CONFIG(graphicsview)
        if (tlw->d_func()->extra->proxyWidget) {
            resetWidget(w);
            continue;
        }
#endif

        if (!isDrawnInEffect(w) && !hasDirtySiblingsAbove && wd->isOpaque
                && !dirty.intersects(widgetDirty.boundingRect())) {
            opaqueNonOverlappedWidgets.append(w);
        } else {
            resetWidget(w);
            dirty += widgetDirty;
        }
    }
    dirtyWidgets.clear();

    // Find all render-to-texture child widgets (including self).
    // The search is cut at native widget boundaries, meaning that each native child widget
    // has its own list for the subtree below it.
    QTLWExtra *tlwExtra = tlw->d_func()->topData();
    tlwExtra->widgetTextures.clear();
    findAllTextureWidgetsRecursively(tlw, tlw);

    if (toClean.isEmpty()) {
        // Nothing to repaint. However renderToTexture widgets are handled
        // specially, they are not in the regular dirty list, in order to
        // prevent triggering unnecessary backingstore painting when only the
        // texture content changes. Check if we have such widgets in the special
        // dirty list.
        QVarLengthArray<QWidget *, 16> paintPending;
        const int numPaintPending = dirtyRenderToTextureWidgets.size();
        paintPending.reserve(numPaintPending);
        for (int i = 0; i < numPaintPending; ++i) {
            QWidget *w = dirtyRenderToTextureWidgets.at(i);
            paintPending << w;
            resetWidget(w);
        }
        dirtyRenderToTextureWidgets.clear();
        for (int i = 0; i < numPaintPending; ++i) {
            QWidget *w = paintPending[i];
            w->d_func()->sendPaintEvent(w->rect());
            if (w != tlw) {
                QWidget *npw = w->nativeParentWidget();
                if (hasPlatformWindow(w) || (npw && npw != tlw)) {
                    if (!hasPlatformWindow(w))
                        w = npw;
                    markNeedsFlush(w);
                }
            }
        }

        // We might have newly exposed areas on the screen if this function was
        // called from sync(QWidget *, QRegion)), so we have to make sure those
        // are flushed. We also need to composite the renderToTexture widgets.
        flush();

        return;
    }

    for (const auto &tl : tlwExtra->widgetTextures) {
        for (int i = 0; i < tl->count(); ++i) {
            QWidget *w = static_cast<QWidget *>(tl->source(i));
            if (dirtyRenderToTextureWidgets.contains(w)) {
                const QRect rect = tl->geometry(i); // mapped to the tlw already
                // Set a flag to indicate that the paint event for this
                // render-to-texture widget must not to be optimized away.
                w->d_func()->renderToTextureReallyDirty = 1;
                dirty += rect;
                toClean += rect;
            }
        }
    }
    for (int i = 0; i < dirtyRenderToTextureWidgets.size(); ++i)
        resetWidget(dirtyRenderToTextureWidgets.at(i));
    dirtyRenderToTextureWidgets.clear();

#if QT_CONFIG(graphicsview)
    if (tlw->d_func()->extra->proxyWidget) {
        updateStaticContentsSize();
        dirty = QRegion();
        updateRequestSent = false;
        for (const QRect &rect : toClean)
            tlw->d_func()->extra->proxyWidget->update(rect);
        return;
    }
#endif

    store->beginPaint(toClean);

    // Must do this before sending any paint events because
    // the size may change in the paint event.
    updateStaticContentsSize();
    const QRegion dirtyCopy(dirty);
    dirty = QRegion();
    updateRequestSent = false;

    // Paint opaque non overlapped widgets.
    for (int i = 0; i < opaqueNonOverlappedWidgets.size(); ++i) {
        QWidget *w = opaqueNonOverlappedWidgets[i];
        QWidgetPrivate *wd = w->d_func();

        QWidgetPrivate::DrawWidgetFlags flags = QWidgetPrivate::DrawRecursive;
        // Scrolled and moved widgets must draw all children.
        if (!wd->isScrolled && !wd->isMoved)
            flags |= QWidgetPrivate::DontDrawOpaqueChildren;
        if (w == tlw)
            flags |= QWidgetPrivate::DrawAsRoot;

        QRegion toBePainted(wd->dirty);
        resetWidget(w);

        QPoint offset;
        if (w != tlw)
            offset += w->mapTo(tlw, QPoint());
        wd->drawWidget(store->paintDevice(), toBePainted, offset, flags, nullptr, this);
    }

    // Paint the rest with composition.
    if (repaintAllWidgets || !dirtyCopy.isEmpty()) {
        QWidgetPrivate::DrawWidgetFlags flags = QWidgetPrivate::DrawAsRoot | QWidgetPrivate::DrawRecursive
                | QWidgetPrivate::UseEffectRegionBounds;
        tlw->d_func()->drawWidget(store->paintDevice(), dirtyCopy, QPoint(), flags, nullptr, this);
    }

    store->endPaint();

    flush();
}